

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps.c
# Opt level: O0

void destroy_fps(FPS *fps)

{
  undefined8 *in_RDI;
  
  free((void *)*in_RDI);
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  free(in_RDI);
  return;
}

Assistant:

void destroy_fps(FPS * fps)
{
   free(fps->samples);
   fps->samples = NULL;
   fps->nSamples = 0;
   fps->frameCounter = 0;
   free(fps);
   fps = NULL;
}